

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Error tt_size_run_prep(TT_Size size,FT_Bool pedantic)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TT_Face face;
  TT_ExecContext exec;
  FT_ULong FVar3;
  FT_Byte *pFVar4;
  undefined8 uVar5;
  FT_UShort FVar6;
  FT_UShort FVar7;
  FT_F2Dot14 FVar8;
  FT_Error FVar9;
  long lVar10;
  TT_GraphicsState *pTVar11;
  TT_GraphicsState *pTVar12;
  byte bVar13;
  
  bVar13 = 0;
  face = (TT_Face)(size->root).face;
  exec = size->context;
  FVar9 = TT_Load_Context(exec,face,size);
  if (FVar9 == 0) {
    exec->callTop = 0;
    exec->top = 0;
    exec->instruction_trap = '\0';
    exec->pedantic_hinting = pedantic;
    FVar3 = face->cvt_program_size;
    pFVar4 = face->cvt_program;
    exec->codeRangeTable[1].base = pFVar4;
    exec->codeRangeTable[1].size = FVar3;
    exec->codeRangeTable[2].base = (FT_Byte *)0x0;
    exec->codeRangeTable[2].size = 0;
    if (face->cvt_program_size == 0) {
      FVar9 = 0;
    }
    else {
      exec->code = pFVar4;
      exec->codeSize = FVar3;
      exec->IP = 0;
      exec->curRange = 2;
      FVar9 = (*face->interpreter)(exec);
    }
    size->cvt_ready = FVar9;
    *(undefined8 *)&(exec->GS).dualVector.y = 0x4000000040000000;
    (exec->GS).freeVector.y = 0;
    (exec->GS).rp0 = 0;
    (exec->GS).rp1 = 0;
    (exec->GS).rp2 = 0;
    (exec->GS).dualVector.x = 0x4000;
    (exec->GS).gep0 = 1;
    (exec->GS).gep1 = 1;
    (exec->GS).gep2 = 1;
    (exec->GS).loop = 1;
    pTVar11 = &exec->GS;
    pTVar12 = &size->GS;
    for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
      FVar6 = pTVar11->rp1;
      FVar7 = pTVar11->rp2;
      FVar8 = (pTVar11->dualVector).x;
      pTVar12->rp0 = pTVar11->rp0;
      pTVar12->rp1 = FVar6;
      pTVar12->rp2 = FVar7;
      (pTVar12->dualVector).x = FVar8;
      pTVar11 = (TT_GraphicsState *)((long)pTVar11 + (ulong)bVar13 * -0x10 + 8);
      pTVar12 = (TT_GraphicsState *)((long)pTVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    size->num_function_defs = exec->numFDefs;
    size->num_instruction_defs = exec->numIDefs;
    size->max_func = exec->maxFunc;
    size->max_ins = exec->maxIns;
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&exec->codeRangeTable[0].base + lVar10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&size->codeRangeTable[0].base + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x30);
  }
  return FVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_prep( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;


    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->instruction_trap = FALSE;

    exec->pedantic_hinting = pedantic;

    TT_Set_CodeRange( exec,
                      tt_coderange_cvt,
                      face->cvt_program,
                      (FT_Long)face->cvt_program_size );

    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->cvt_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_cvt, 0 );

      FT_TRACE4(( "Executing `prep' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->cvt_ready = error;

    /* UNDOCUMENTED!  The MS rasterizer doesn't allow the following */
    /* graphics state variables to be modified by the CVT program.  */

    exec->GS.dualVector.x = 0x4000;
    exec->GS.dualVector.y = 0;
    exec->GS.projVector.x = 0x4000;
    exec->GS.projVector.y = 0x0;
    exec->GS.freeVector.x = 0x4000;
    exec->GS.freeVector.y = 0x0;

    exec->GS.rp0 = 0;
    exec->GS.rp1 = 0;
    exec->GS.rp2 = 0;

    exec->GS.gep0 = 1;
    exec->GS.gep1 = 1;
    exec->GS.gep2 = 1;

    exec->GS.loop = 1;

    /* save as default graphics state */
    size->GS = exec->GS;

    TT_Save_Context( exec, size );

    return error;
  }